

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O0

void __thiscall
ft::treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>::attach
          (treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_> *this)

{
  treeNode<int> *ptVar1;
  node *pnVar2;
  node *pnVar3;
  bool bVar4;
  node *local_20;
  node *l;
  node *f;
  treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_> *this_local;
  
  l = root(this);
  local_20 = root(this);
  while( true ) {
    pnVar3 = l->left;
    pnVar2 = NIL(this);
    bVar4 = false;
    if (pnVar3 != pnVar2) {
      pnVar3 = l->left;
      pnVar2 = firstNode(this);
      bVar4 = pnVar3 != pnVar2;
    }
    if (!bVar4) break;
    l = l->left;
  }
  pnVar3 = firstNode(this);
  l->left = pnVar3;
  pnVar3 = firstNode(this);
  pnVar3->parent = l;
  while( true ) {
    ptVar1 = local_20->right;
    pnVar3 = NIL(this);
    bVar4 = false;
    if (ptVar1 != pnVar3) {
      ptVar1 = local_20->right;
      pnVar3 = lastNode(this);
      bVar4 = ptVar1 != pnVar3;
    }
    if (!bVar4) break;
    local_20 = local_20->right;
  }
  pnVar3 = lastNode(this);
  local_20->right = pnVar3;
  pnVar3 = lastNode(this);
  pnVar3->parent = local_20;
  return;
}

Assistant:

void 	attach() {
		node*	f = this->root();
		node*	l = this->root();

		while (f->left != this->NIL() && f->left != this->firstNode()) {
			f = f->left;
		}

		f->left = this->firstNode();
		this->firstNode()->parent = f;

		while (l->right != this->NIL() && l->right != this->lastNode()) {
			l = l->right;
		}

		l->right = this->lastNode();
		this->lastNode()->parent = l;
	}